

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Object_State_Header.cpp
# Opt level: O3

KString * __thiscall
KDIS::PDU::Object_State_Header::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,Object_State_Header *this)

{
  ostream *poVar1;
  KINT32 Value;
  KStringStream ss;
  KString local_200;
  KString local_1e0;
  KString local_1c0;
  stringstream local_1a0 [16];
  ostream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>(local_190,"Object ID:\n",0xb);
  DATA_TYPE::EntityIdentifier::GetAsString_abi_cxx11_(&local_1c0,&this->m_ObjID);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_190,local_1c0._M_dataplus._M_p,local_1c0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Referenced Object ID:\n",0x16);
  DATA_TYPE::EntityIdentifier::GetAsString_abi_cxx11_(&local_1e0,&this->m_RefObjID);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,local_1e0._M_dataplus._M_p,local_1e0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Update Number: ",0xf);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Force ID:      ",0xf);
  DATA_TYPE::ENUMS::GetEnumAsStringForceID_abi_cxx11_
            (&local_200,(ENUMS *)(ulong)this->m_ui8ForceID,Value);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,local_200._M_dataplus._M_p,local_200._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
    operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
    operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

KString Object_State_Header::GetAsString() const
{
    KStringStream ss;

    // We will let the derived pdu get the header string so they can insert their
    // name between the header values and these.
    ss << "Object ID:\n"
       << m_ObjID.GetAsString()
       << "Referenced Object ID:\n"
       << m_RefObjID.GetAsString()
       << "Update Number: " << m_ui16UpdateNum                        << "\n"
       << "Force ID:      " << GetEnumAsStringForceID( m_ui8ForceID ) << "\n";

    return ss.str();
}